

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reporter.cc
# Opt level: O2

void __thiscall benchmark::JSONReporter::PrintRunData(JSONReporter *this,Run *run)

{
  ostream *poVar1;
  double dVar2;
  allocator local_81;
  string local_80;
  string local_60;
  double local_40;
  double local_38;
  string indent;
  
  local_40 = run->cpu_accumulated_time * 1000000000.0;
  local_38 = run->real_accumulated_time * 1000000000.0;
  if (run->iterations != 0) {
    dVar2 = (double)run->iterations;
    local_38 = local_38 / dVar2;
    local_40 = local_40 / dVar2;
  }
  indent._M_dataplus._M_p = (pointer)&indent.field_2;
  std::__cxx11::string::_M_construct((ulong)&indent,'\x06');
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&indent);
  std::__cxx11::string::string((string *)&local_80,"name",&local_81);
  anon_unknown_1::FormatKV(&local_60,&local_80,&run->benchmark_name);
  poVar1 = std::operator<<(poVar1,(string *)&local_60);
  std::operator<<(poVar1,",\n");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&indent);
  std::__cxx11::string::string((string *)&local_80,"iterations",&local_81);
  anon_unknown_1::FormatKV(&local_60,&local_80,run->iterations);
  poVar1 = std::operator<<(poVar1,(string *)&local_60);
  std::operator<<(poVar1,",\n");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&indent);
  std::__cxx11::string::string((string *)&local_80,"real_time",&local_81);
  anon_unknown_1::FormatKV(&local_60,&local_80,(long)(local_38 + 0.5));
  poVar1 = std::operator<<(poVar1,(string *)&local_60);
  std::operator<<(poVar1,",\n");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&indent);
  std::__cxx11::string::string((string *)&local_80,"cpu_time",&local_81);
  anon_unknown_1::FormatKV(&local_60,&local_80,(long)(local_40 + 0.5));
  std::operator<<(poVar1,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  if (0.0 < run->bytes_per_second) {
    poVar1 = std::operator<<((ostream *)&std::cout,",\n");
    poVar1 = std::operator<<(poVar1,(string *)&indent);
    std::__cxx11::string::string((string *)&local_80,"bytes_per_second",&local_81);
    anon_unknown_1::FormatKV(&local_60,&local_80,(long)(run->bytes_per_second + 0.5));
    std::operator<<(poVar1,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  if (0.0 < run->items_per_second) {
    poVar1 = std::operator<<((ostream *)&std::cout,",\n");
    poVar1 = std::operator<<(poVar1,(string *)&indent);
    std::__cxx11::string::string((string *)&local_80,"items_per_second",&local_81);
    anon_unknown_1::FormatKV(&local_60,&local_80,(long)(run->items_per_second + 0.5));
    std::operator<<(poVar1,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  if ((run->report_label)._M_string_length != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,",\n");
    poVar1 = std::operator<<(poVar1,(string *)&indent);
    std::__cxx11::string::string((string *)&local_80,"label",&local_81);
    anon_unknown_1::FormatKV(&local_60,&local_80,&run->report_label);
    std::operator<<(poVar1,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  std::operator<<((ostream *)&std::cout,'\n');
  std::__cxx11::string::~string((string *)&indent);
  return;
}

Assistant:

void JSONReporter::PrintRunData(Run const& run) {
    double const multiplier = 1e9; // nano second multiplier
    double cpu_time = run.cpu_accumulated_time * multiplier;
    double real_time = run.real_accumulated_time * multiplier;
    if (run.iterations != 0) {
        real_time = real_time / static_cast<double>(run.iterations);
        cpu_time = cpu_time / static_cast<double>(run.iterations);
    }

    std::string indent(6, ' ');
    std::ostream& out = std::cout;
    out << indent
        << FormatKV("name", run.benchmark_name)
        << ",\n";
    out << indent
        << FormatKV("iterations", run.iterations)
        << ",\n";
    out << indent
        << FormatKV("real_time", RoundDouble(real_time))
        << ",\n";
    out << indent
        << FormatKV("cpu_time", RoundDouble(cpu_time));
    if (run.bytes_per_second > 0.0) {
        out << ",\n" << indent
            << FormatKV("bytes_per_second", RoundDouble(run.bytes_per_second));
    }
    if (run.items_per_second > 0.0) {
        out << ",\n" << indent
            << FormatKV("items_per_second", RoundDouble(run.items_per_second));
    }
    if (!run.report_label.empty()) {
        out << ",\n" << indent
            << FormatKV("label", run.report_label);
    }
    out << '\n';
}